

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::negExpr(Parser *this)

{
  long lVar1;
  Report *this_00;
  undefined8 uVar2;
  Expr *pEVar3;
  _Base_ptr p_Var4;
  Opcode OVar5;
  LiteralType args;
  pointer __dest;
  undefined8 *puVar6;
  pointer *__ptr;
  long in_RSI;
  size_type __dnew;
  SourceLocation loc;
  Expr *local_98;
  string local_90;
  _Base_ptr local_70;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_68;
  SymbolTable *local_60;
  Runtime *local_58 [3];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68._M_head_impl = (Lexer *)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  uStack_38 = (undefined4)*(undefined8 *)(lVar1 + 0x98);
  uStack_34 = (undefined4)((ulong)*(undefined8 *)(lVar1 + 0x98) >> 0x20);
  local_58[2] = *(Runtime **)(lVar1 + 0x88);
  uStack_40 = (undefined4)*(undefined8 *)(lVar1 + 0x90);
  uStack_3c = (undefined4)((ulong)*(undefined8 *)(lVar1 + 0x90) >> 0x20);
  if ((*(Lexer **)(in_RSI + 0x30))->token_ != Minus) {
    bitNotExpr(this);
    goto LAB_00124650;
  }
  Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
  negExpr((Parser *)&local_98);
  pEVar3 = local_98;
  if (local_98 == (Expr *)0x0) {
LAB_0012459a:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
    OVar5 = makeOperator(Minus,local_98);
    if (OVar5 == EXIT) {
      lVar1 = *(long *)(in_RSI + 0x30);
      this_00 = *(Report **)(in_RSI + 0x68);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_70 = (_Base_ptr)0x42;
      __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
      p_Var4 = local_70;
      local_90.field_2._M_allocated_capacity = (size_type)local_70;
      local_90._M_dataplus._M_p = __dest;
      memcpy(__dest,"Type cast error in unary \'neg\'-operator. Invalid source type <{}>.",0x42);
      local_90._M_string_length = (size_type)p_Var4;
      __dest[(long)p_Var4] = '\0';
      args = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])(pEVar3);
      diagnostics::Report::typeError<flow::LiteralType>
                (this_00,(SourceLocation *)(lVar1 + 0x30),&local_90,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        (ulong)(local_90.field_2._M_allocated_capacity + 1));
      }
      goto LAB_0012459a;
    }
    uStack_34 = *(undefined4 *)(*(long *)(in_RSI + 0x30) + 100);
    uVar2 = *(undefined8 *)(*(long *)(in_RSI + 0x30) + 0x5c);
    uStack_3c = (undefined4)uVar2;
    uStack_38 = (undefined4)((ulong)uVar2 >> 0x20);
    puVar6 = (undefined8 *)operator_new(0x50);
    *puVar6 = &PTR__ASTNode_001947b0;
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar6 + 1),local_68._M_head_impl,
               (long)&(local_60->symbols_).
                      super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)local_68._M_head_impl);
    puVar6[7] = CONCAT44(uStack_34,uStack_38);
    *(undefined4 *)(puVar6 + 5) = local_58[2]._0_4_;
    *(undefined4 *)((long)puVar6 + 0x2c) = local_58[2]._4_4_;
    *(undefined4 *)(puVar6 + 6) = uStack_40;
    *(undefined4 *)((long)puVar6 + 0x34) = uStack_3c;
    *puVar6 = &PTR__UnaryExpr_00194b48;
    *(Opcode *)(puVar6 + 8) = OVar5;
    puVar6[9] = local_98;
    *(undefined8 **)&(this->features_)._M_t._M_impl = puVar6;
    local_98 = (Expr *)0x0;
  }
  if (local_98 != (Expr *)0x0) {
    (*(local_98->super_ASTNode)._vptr_ASTNode[1])();
  }
LAB_00124650:
  if (local_68._M_head_impl != (Lexer *)local_58) {
    operator_delete(local_68._M_head_impl,(ulong)((long)&local_58[0]->_vptr_Runtime + 1));
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::negExpr() {
  // negExpr ::= ['-'] primaryExpr
  SourceLocation loc = location();

  if (consumeIf(Token::Minus)) {
    std::unique_ptr<Expr> e = negExpr();
    if (!e) return nullptr;

    Opcode op = makeOperator(Token::Minus, e.get());
    if (op == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error in unary 'neg'-operator. Invalid source type <{}>.",
          e->getType());
      return nullptr;
    }

    e = std::make_unique<UnaryExpr>(op, std::move(e), loc.update(end()));
    return e;
  } else {
    return bitNotExpr();
  }
}